

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_session_load
              (secp256k1_context *ctx,secp256k1_musig_session_internal *session_i,
              secp256k1_musig_session *session)

{
  int iVar1;
  secp256k1_callback *in_RDX;
  uint *in_RSI;
  secp256k1_scalar *in_RDI;
  uchar *ptr;
  secp256k1_callback *cb;
  uint local_4;
  
  cb = in_RDX;
  iVar1 = secp256k1_memcmp_var(in_RDX,secp256k1_musig_session_cache_magic,4);
  if (iVar1 == 0) {
    *in_RSI = (uint)*(byte *)((long)&in_RDX->fn + 4);
    *(undefined8 *)(in_RSI + 1) = *(undefined8 *)((long)&in_RDX->fn + 5);
    *(undefined8 *)(in_RSI + 3) = *(undefined8 *)((long)&in_RDX->data + 5);
    *(undefined8 *)(in_RSI + 5) = *(undefined8 *)((long)&in_RDX[1].fn + 5);
    *(undefined8 *)(in_RSI + 7) = *(undefined8 *)((long)&in_RDX[1].data + 5);
    secp256k1_scalar_set_b32(in_RDI,(uchar *)in_RSI,(int *)cb);
    secp256k1_scalar_set_b32(in_RDI,(uchar *)in_RSI,(int *)cb);
    secp256k1_scalar_set_b32(in_RDI,(uchar *)in_RSI,(int *)cb);
  }
  else {
    secp256k1_callback_call(cb,(char *)in_RDX);
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static int secp256k1_musig_session_load(const secp256k1_context* ctx, secp256k1_musig_session_internal *session_i, const secp256k1_musig_session *session) {
    const unsigned char *ptr = session->data;

    ARG_CHECK(secp256k1_memcmp_var(ptr, secp256k1_musig_session_cache_magic, 4) == 0);
    ptr += 4;
    session_i->fin_nonce_parity = *ptr;
    ptr += 1;
    memcpy(session_i->fin_nonce, ptr, 32);
    ptr += 32;
    secp256k1_scalar_set_b32(&session_i->noncecoef, ptr, NULL);
    ptr += 32;
    secp256k1_scalar_set_b32(&session_i->challenge, ptr, NULL);
    ptr += 32;
    secp256k1_scalar_set_b32(&session_i->s_part, ptr, NULL);
    return 1;
}